

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_message.c
# Opt level: O0

void mqttmessage_destroy(MQTT_MESSAGE_HANDLE handle)

{
  MQTT_MESSAGE_HANDLE handle_local;
  
  if (handle != (MQTT_MESSAGE_HANDLE)0x0) {
    if (handle->topicName != (char *)0x0) {
      free(handle->topicName);
    }
    if ((handle->appPayload).message != (uint8_t *)0x0) {
      free((handle->appPayload).message);
    }
    free(handle);
  }
  return;
}

Assistant:

void mqttmessage_destroy(MQTT_MESSAGE_HANDLE handle)
{
    /* Codes_SRS_MQTTMESSAGE_07_005: [If the handle parameter is NULL then mqttmessage_destroyMessage shall do nothing] */
    if (handle != NULL)
    {
        /* Codes_SRS_MQTTMESSAGE_07_006: [mqttmessage_destroyMessage shall free all resources associated with the MQTT_MESSAGE_HANDLE value] */
        if (handle->topicName != NULL)
        {
            free(handle->topicName);
        }
        if (handle->appPayload.message != NULL)
        {
            free(handle->appPayload.message);
        }
        free(handle);
    }
}